

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

bool __thiscall
Js::JavascriptArray::ArrayElementEnumerator::MoveNext<int>(ArrayElementEnumerator *this)

{
  bool bVar1;
  uint uVar2;
  SparseArraySegmentBase **ppSVar3;
  uint *puVar4;
  uint local_1c;
  ArrayElementEnumerator *local_18;
  ArrayElementEnumerator *this_local;
  
  local_18 = this;
  while( true ) {
    do {
      if (this->seg == (SparseArraySegmentBase *)0x0) {
        return false;
      }
      while (uVar2 = this->index + 1, this->index = uVar2, uVar2 < this->endIndex) {
        bVar1 = SparseArraySegment<int>::IsMissingItem((int *)(&this->seg[1].left + this->index));
        if (!bVar1) {
          return true;
        }
      }
      ppSVar3 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                          ((WriteBarrierPtr *)&this->seg->next);
      this->seg = *ppSVar3;
    } while (this->seg == (SparseArraySegmentBase *)0x0);
    if (this->end <= this->seg->left) break;
    this->index = 0xffffffff;
    local_1c = this->end - this->seg->left;
    puVar4 = min<unsigned_int>(&local_1c,&this->seg->length);
    this->endIndex = *puVar4;
  }
  this->seg = (SparseArraySegmentBase *)0x0;
  return false;
}

Assistant:

inline bool JavascriptArray::ArrayElementEnumerator::MoveNext()
    {
        while (seg)
        {
            // Look for next non-null item in current segment
            while (++index < endIndex)
            {
                if (!SparseArraySegment<T>::IsMissingItem(&((SparseArraySegment<T>*)seg)->elements[index]))
                {
                    return true;
                }
            }

            // Move to next segment
            seg = seg->next;
            if (seg)
            {
                if (seg->left >= end)
                {
                    seg = nullptr;
                    break;
                }
                else
                {
                    index = static_cast<uint32>(-1);
                    endIndex = min(end - seg->left, seg->length);
                }
            }
        }

        return false;
    }